

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_bool32 ma_dr_flac__seek_to_approximate_flac_frame_to_byte
                    (ma_dr_flac *pFlac,ma_uint64 targetByte,ma_uint64 rangeLo,ma_uint64 rangeHi,
                    ma_uint64 *pLastSuccessfulSeekOffset)

{
  ma_bool32 mVar1;
  ma_dr_flac *in_RCX;
  ulong uVar2;
  long in_RDX;
  ma_dr_flac *in_RSI;
  ma_dr_flac *in_RDI;
  ma_dr_flac *in_R8;
  ma_uint64 lastTargetByte;
  ma_dr_flac *pFlac_00;
  ma_dr_flac *local_18;
  
  in_R8->onMeta = (ma_dr_flac_meta_proc)in_RDI->firstFLACFramePosInBytes;
  local_18 = in_RSI;
  do {
    pFlac_00 = local_18;
    mVar1 = ma_dr_flac__seek_to_byte((ma_dr_flac_bs *)in_RCX,(ma_uint64)in_R8);
    if (mVar1 == 0) {
      if (local_18 == (ma_dr_flac *)0x0) {
        ma_dr_flac__seek_to_first_frame(in_R8);
        return 0;
      }
      uVar2 = (long)in_RCX - in_RDX;
    }
    else {
      memset(&in_RDI->currentFLACFrame,0,0xa0);
      mVar1 = ma_dr_flac__read_and_decode_next_flac_frame(pFlac_00);
      if (mVar1 != 0) {
        ma_dr_flac__get_pcm_frame_range_of_current_flac_frame
                  (in_RDI,&in_RDI->currentPCMFrame,(ma_uint64 *)0x0);
        in_R8->onMeta = (ma_dr_flac_meta_proc)local_18;
        return 1;
      }
      uVar2 = (long)in_RCX - in_RDX;
    }
    local_18 = (ma_dr_flac *)(in_RDX + (uVar2 >> 1));
    in_RCX = local_18;
  } while (local_18 != pFlac_00);
  return 0;
}

Assistant:

static ma_bool32 ma_dr_flac__seek_to_approximate_flac_frame_to_byte(ma_dr_flac* pFlac, ma_uint64 targetByte, ma_uint64 rangeLo, ma_uint64 rangeHi, ma_uint64* pLastSuccessfulSeekOffset)
{
    MA_DR_FLAC_ASSERT(pFlac != NULL);
    MA_DR_FLAC_ASSERT(pLastSuccessfulSeekOffset != NULL);
    MA_DR_FLAC_ASSERT(targetByte >= rangeLo);
    MA_DR_FLAC_ASSERT(targetByte <= rangeHi);
    *pLastSuccessfulSeekOffset = pFlac->firstFLACFramePosInBytes;
    for (;;) {
        ma_uint64 lastTargetByte = targetByte;
        if (!ma_dr_flac__seek_to_byte(&pFlac->bs, targetByte)) {
            if (targetByte == 0) {
                ma_dr_flac__seek_to_first_frame(pFlac);
                return MA_FALSE;
            }
            targetByte = rangeLo + ((rangeHi - rangeLo)/2);
            rangeHi = targetByte;
        } else {
            MA_DR_FLAC_ZERO_MEMORY(&pFlac->currentFLACFrame, sizeof(pFlac->currentFLACFrame));
#if 1
            if (!ma_dr_flac__read_and_decode_next_flac_frame(pFlac)) {
                targetByte = rangeLo + ((rangeHi - rangeLo)/2);
                rangeHi = targetByte;
            } else {
                break;
            }
#else
            if (!ma_dr_flac__read_next_flac_frame_header(&pFlac->bs, pFlac->bitsPerSample, &pFlac->currentFLACFrame.header)) {
                targetByte = rangeLo + ((rangeHi - rangeLo)/2);
                rangeHi = targetByte;
            } else {
                break;
            }
#endif
        }
        if(targetByte == lastTargetByte) {
            return MA_FALSE;
        }
    }
    ma_dr_flac__get_pcm_frame_range_of_current_flac_frame(pFlac, &pFlac->currentPCMFrame, NULL);
    MA_DR_FLAC_ASSERT(targetByte <= rangeHi);
    *pLastSuccessfulSeekOffset = targetByte;
    return MA_TRUE;
}